

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::LoadLWO2ShaderBlock(LWOImporter *this,SubChunkHeader *param_1,uint size)

{
  uint8_t *puVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  long lVar5;
  Logger *this_00;
  DeadlyImportError *this_01;
  char *__s1;
  char *__s2;
  list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_> *this_02;
  const_iterator local_d8;
  _Self local_d0;
  _Self local_c8;
  iterator it;
  uint8_t *next;
  string local_b0;
  SubChunkHeader local_8c;
  SubChunkHeader head;
  undefined1 local_78 [8];
  Shader shader;
  Surface *surf;
  uint8_t *end;
  uint size_local;
  SubChunkHeader *param_1_local;
  LWOImporter *this_local;
  
  puVar1 = this->mFileBuffer;
  bVar2 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::empty
                    (this->mSurfaces);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!mSurfaces->empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x2ab,
                  "void Assimp::LWOImporter::LoadLWO2ShaderBlock(IFF::SubChunkHeader *, unsigned int)"
                 );
  }
  shader._64_8_ =
       std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::back
                 (this->mSurfaces);
  LWO::Shader::Shader((Shader *)local_78);
  GetS0(this,(string *)local_78,size);
  lVar5 = std::__cxx11::string::length();
  if (lVar5 == 0) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"LWO2: Ill-formed SURF.BLOK ordinal string");
    std::__cxx11::string::operator=((string *)local_78,"");
  }
  while (this->mFileBuffer + 6 < puVar1 + size) {
    local_8c = IFF::LoadSubChunk(&this->mFileBuffer);
    if (puVar1 + size < this->mFileBuffer + (int)(uint)local_8c.length) {
      next._6_1_ = 1;
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"LWO2: Invalid shader header chunk length",
                 (allocator<char> *)((long)&next + 7));
      DeadlyImportError::DeadlyImportError(this_01,&local_b0);
      next._6_1_ = 0;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    it._M_node = (_List_node_base *)(this->mFileBuffer + local_8c.length);
    if (local_8c.type == 0x454e4142) {
      uVar3 = GetU2(this);
      shader.functionName.field_2._M_local_buf[8] = -(uVar3 != 0) & 1;
    }
    else if (local_8c.type == 0x46554e43) {
      GetS0(this,(string *)((long)&shader.ordinal.field_2 + 8),(uint)local_8c.length);
    }
    this->mFileBuffer = (uint8_t *)it._M_node;
  }
  local_c8._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::begin
                 ((list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_> *)
                  (shader._64_8_ + 0x78));
  do {
    local_d0._M_node =
         (_List_node_base *)
         std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::end
                   ((list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_> *)
                    (shader._64_8_ + 0x78));
    bVar2 = std::operator!=(&local_c8,&local_d0);
    if (!bVar2) {
      std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::push_back
                ((list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_> *)
                 (shader._64_8_ + 0x78),(value_type *)local_78);
LAB_006da4be:
      LWO::Shader::~Shader((Shader *)local_78);
      return;
    }
    __s1 = (char *)std::__cxx11::string::c_str();
    std::_List_iterator<Assimp::LWO::Shader>::operator*(&local_c8);
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar4 = strcmp(__s1,__s2);
    if (iVar4 < 0) {
      this_02 = (list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_> *)
                (shader._64_8_ + 0x78);
      std::_List_const_iterator<Assimp::LWO::Shader>::_List_const_iterator(&local_d8,&local_c8);
      std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::insert
                (this_02,local_d8,(value_type *)local_78);
      goto LAB_006da4be;
    }
    std::_List_iterator<Assimp::LWO::Shader>::operator++(&local_c8);
  } while( true );
}

Assistant:

void LWOImporter::LoadLWO2ShaderBlock(LE_NCONST IFF::SubChunkHeader* /*head*/, unsigned int size )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    ai_assert(!mSurfaces->empty());
    LWO::Surface& surf = mSurfaces->back();
    LWO::Shader shader;

    // get the ordinal string
    GetS0( shader.ordinal, size);

    // we could crash later if this is an empty string ...
    if (!shader.ordinal.length())
    {
        ASSIMP_LOG_ERROR("LWO2: Ill-formed SURF.BLOK ordinal string");
        shader.ordinal = "\x00";
    }

    // read the header
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        const IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid shader header chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_ENAB:
            shader.enabled = GetU2() ? true : false;
            break;

        case AI_LWO_FUNC:
            GetS0( shader.functionName, head.length );
        }
        mFileBuffer = next;
    }

    // now attach the shader to the parent surface - sort by ordinal string
    for (ShaderList::iterator it = surf.mShaders.begin();it != surf.mShaders.end(); ++it)   {
        if (::strcmp(shader.ordinal.c_str(),(*it).ordinal.c_str()) < 0) {
            surf.mShaders.insert(it,shader);
            return;
        }
    }
    surf.mShaders.push_back(shader);
}